

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadCordFallback
          (EpsCopyInputStream *this,char *ptr,int size,Cord *cord)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  
  iVar1 = (int)this->buffer_end_ - (int)ptr;
  if (this->zcis_ == (ZeroCopyInputStream *)0x0) {
    if (iVar1 + 0x10 < size) {
      iVar1 = BytesAvailable(this,ptr);
      do {
        iVar6 = size - iVar1;
        if (iVar6 == 0 || size < iVar1) {
          ReadCordFallback((EpsCopyInputStream *)&stack0xffffffffffffffc0);
          goto LAB_002ef71a;
        }
        if (this->next_chunk_ == (char *)0x0) {
          return (char *)0x0;
        }
        src_00._M_len = (size_t)iVar1;
        src_00._M_str = ptr;
        absl::lts_20250127::Cord::InlineRep::AppendArray(&cord->contents_,src_00,kAppendString);
        if (this->limit_ < 0x11) {
          return (char *)0x0;
        }
        pcVar2 = Next(this);
        if (pcVar2 == (char *)0x0) {
          return (char *)0x0;
        }
        ptr = pcVar2 + 0x10;
        iVar1 = BytesAvailable(this,ptr);
        size = iVar6;
      } while (iVar1 < iVar6);
      sVar3 = (size_t)iVar6;
      src_01._M_str = ptr;
      src_01._M_len = sVar3;
      absl::lts_20250127::Cord::InlineRep::AppendArray(&cord->contents_,src_01,kAppendString);
    }
    else {
      sVar3 = (size_t)size;
      src_02._M_str = ptr;
      src_02._M_len = sVar3;
      absl::lts_20250127::Cord::operator=(cord,src_02);
    }
    return ptr + sVar3;
  }
  iVar6 = this->limit_ + iVar1;
  iVar7 = iVar6 - size;
  if (iVar6 < size) {
    return (char *)0x0;
  }
  uVar5 = iVar1 + 0x10;
  pcVar2 = this->patch_buffer_;
  if ((int)uVar5 < 0x21 && (ulong)((long)ptr - (long)pcVar2) < 0x21) {
    if ((iVar1 == 0) && (this->next_chunk_ != pcVar2 && this->next_chunk_ != (char *)0x0)) {
      absl::lts_20250127::Cord::Clear(cord);
      uVar5 = this->size_;
    }
    else {
      uVar4 = size - uVar5;
      if (uVar4 == 0 || size < (int)uVar5) {
LAB_002ef71a:
        ReadCordFallback();
LAB_002ef726:
        ReadCordFallback((EpsCopyInputStream *)&stack0xffffffffffffffc0);
      }
      src._M_len = (size_t)(int)uVar5;
      src._M_str = ptr;
      absl::lts_20250127::Cord::operator=(cord,src);
      if (this->next_chunk_ == pcVar2) {
        iVar1 = this->overall_limit_;
        goto LAB_002ef68e;
      }
      if (this->next_chunk_ == (char *)0x0) {
        this->last_tag_minus_1_ = 1;
        return (char *)0x0;
      }
      if (this->size_ < 0x11) goto LAB_002ef726;
      uVar5 = this->size_ - 0x10;
      size = uVar4;
    }
  }
  else {
    absl::lts_20250127::Cord::Clear(cord);
  }
  (*this->zcis_->_vptr_ZeroCopyInputStream[3])(this->zcis_,(ulong)uVar5);
  iVar1 = uVar5 + this->overall_limit_;
  this->overall_limit_ = iVar1;
  uVar4 = size;
LAB_002ef68e:
  if ((int)uVar4 <= iVar1) {
    this->overall_limit_ = iVar1 - uVar4;
    iVar1 = (*this->zcis_->_vptr_ZeroCopyInputStream[6])(this->zcis_,cord,(ulong)uVar4);
    if ((char)iVar1 != '\0') {
      pcVar2 = InitFrom(this,this->zcis_);
      uVar5 = iVar7 + ((int)pcVar2 - (int)this->buffer_end_);
      this->limit_ = uVar5;
      this->limit_end_ = this->buffer_end_ + (int)((int)uVar5 >> 0x1f & uVar5);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadCordFallback(const char* ptr, int size,
                                                 absl::Cord* cord) {
  if (zcis_ == nullptr) {
    int bytes_from_buffer = buffer_end_ - ptr + kSlopBytes;
    if (size <= bytes_from_buffer) {
      *cord = absl::string_view(ptr, size);
      return ptr + size;
    }
    return AppendSize(ptr, size, [cord](const char* p, int s) {
      cord->Append(absl::string_view(p, s));
    });
  }
  int new_limit = buffer_end_ - ptr + limit_;
  if (size > new_limit) return nullptr;
  new_limit -= size;
  int bytes_from_buffer = buffer_end_ - ptr + kSlopBytes;
  const bool in_patch_buf = reinterpret_cast<uintptr_t>(ptr) -
                                reinterpret_cast<uintptr_t>(patch_buffer_) <=
                            kPatchBufferSize;
  if (bytes_from_buffer > kPatchBufferSize || !in_patch_buf) {
    cord->Clear();
    StreamBackUp(bytes_from_buffer);
  } else if (bytes_from_buffer == kSlopBytes && next_chunk_ != nullptr &&
             // Only backup if next_chunk_ points to a valid buffer returned by
             // ZeroCopyInputStream. This happens when NextStream() returns a
             // chunk that's smaller than or equal to kSlopBytes.
             next_chunk_ != patch_buffer_) {
    cord->Clear();
    StreamBackUp(size_);
  } else {
    size -= bytes_from_buffer;
    ABSL_DCHECK_GT(size, 0);
    *cord = absl::string_view(ptr, bytes_from_buffer);
    if (next_chunk_ == patch_buffer_) {
      // We have read to end of the last buffer returned by
      // ZeroCopyInputStream. So the stream is in the right position.
    } else if (next_chunk_ == nullptr) {
      // There is no remaining chunks. We can't read size.
      SetEndOfStream();
      return nullptr;
    } else {
      // Next chunk is already loaded
      ABSL_DCHECK(size_ > kSlopBytes);
      StreamBackUp(size_ - kSlopBytes);
    }
  }
  if (size > overall_limit_) return nullptr;
  overall_limit_ -= size;
  if (!zcis_->ReadCord(cord, size)) return nullptr;
  ptr = InitFrom(zcis_);
  limit_ = new_limit - static_cast<int>(buffer_end_ - ptr);
  limit_end_ = buffer_end_ + (std::min)(0, limit_);
  return ptr;
}